

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::ChooseConfigCase::executeTest
          (ChooseConfigCase *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *attributes,bool checkOrder)

{
  EGLDisplay *egl;
  ostringstream *poVar1;
  ostringstream *this_00;
  int iVar2;
  TestLog *pTVar3;
  EGLConfig config;
  ChooseConfigCase *pCVar4;
  _anonymous_namespace_ *p_Var5;
  bool bVar6;
  deUint32 dVar7;
  EGLint EVar8;
  EGLint EVar9;
  char *__s;
  ConfigAttribValueFmt CVar10;
  void **ppvVar11;
  undefined7 in_register_00000011;
  int *__args;
  pointer ppVar12;
  vector<void_*,_std::allocator<void_*>_> *configs;
  ConfigAttribValueFmt *pCVar13;
  byte bVar14;
  long lVar15;
  vector<int,_std::allocator<int>_> attribList;
  vector<void_*,_std::allocator<void_*>_> resultConfigs;
  string attribStr;
  vector<void_*,_std::allocator<void_*>_> referenceConfigs;
  EGLint numConfigs;
  vector<int,_std::allocator<int>_> local_258;
  vector<void_*,_std::allocator<void_*>_> local_238;
  undefined1 local_218 [40];
  size_t local_1f0;
  vector<void_*,_std::allocator<void_*>_> local_1e8;
  undefined4 local_1c4;
  ChooseConfigCase *local_1c0;
  _anonymous_namespace_ *local_1b8;
  undefined1 local_1b0 [24];
  _Rb_tree_const_iterator<void_*> local_198;
  size_t local_188;
  ios_base local_138 [264];
  
  local_1c4 = (undefined4)CONCAT71(in_register_00000011,checkOrder);
  local_1b8 = (_anonymous_namespace_ *)
              EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  ppVar12 = (attributes->
            super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar12 ==
      (attributes->
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
LAB_00e4a1df:
    local_1b0._0_4_ = 0x3038;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_258,
               (iterator)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_1b0);
  }
  else {
    __args = &ppVar12->second;
    do {
      local_1b0._0_4_ = ((pair<unsigned_int,_int> *)(__args + -1))->first;
      if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_258,
                   (iterator)
                   local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_1b0);
      }
      else {
        *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = ((pair<unsigned_int,_int> *)(__args + -1))->first;
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_258,
                   (iterator)
                   local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *__args;
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      ppVar12 = (pointer)(__args + 1);
      __args = __args + 2;
    } while (ppVar12 !=
             (attributes->
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_00e4a1df;
    *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0x3038;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1c0 = this;
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Attributes:",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  pCVar13 = (ConfigAttribValueFmt *)
            (attributes->
            super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar13 !=
      (ConfigAttribValueFmt *)
      (attributes->
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    this_00 = (ostringstream *)(local_1b0 + 8);
    do {
      iVar2 = pCVar13->value;
      CVar10 = *pCVar13;
      __s = eglu::getConfigAttribName(pCVar13->attribute);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_218,__s,(allocator<char> *)local_1b0);
      if (iVar2 == -1) {
        local_1b0._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(char *)local_218._0_8_,local_218._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": EGL_DONT_CARE",0xf)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
      }
      else {
        local_1b0._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_218._0_8_,local_218._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
        local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)CVar10;
        eglu::operator<<((ostream *)poVar1,(ConfigAttribValueFmt *)&local_238);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
      }
      if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      pCVar13 = pCVar13 + 1;
    } while (pCVar13 !=
             (ConfigAttribValueFmt *)
             (attributes->
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var5 = local_1b8;
  pCVar4 = local_1c0;
  local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (void **)0x0;
  local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (void **)0x0;
  local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (void **)0x0;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
  configs = (vector<void_*,_std::allocator<void_*>_> *)0x0;
  (**(code **)(*(long *)local_1b8 + 0x10))
            (local_1b8,local_1c0->m_display,
             local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,0);
  dVar7 = (**(code **)(*(long *)p_Var5 + 0xf8))(p_Var5);
  eglu::checkError(dVar7,"chooseConfig(m_display, &attribList[0], DE_NULL, 0, &numConfigs)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigTests.cpp"
                   ,0xba);
  std::vector<void_*,_std::allocator<void_*>_>::resize(&local_238,(long)(int)local_1b0._0_4_);
  egl = &pCVar4->m_display;
  if (0 < (int)local_1b0._0_4_) {
    configs = (vector<void_*,_std::allocator<void_*>_> *)
              ((ulong)((long)local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
    (**(code **)(*(long *)p_Var5 + 0x10))
              (p_Var5,*egl,
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start,configs,local_1b0);
    dVar7 = (**(code **)(*(long *)p_Var5 + 0xf8))(p_Var5);
    eglu::checkError(dVar7,
                     "chooseConfig(m_display, &attribList[0], &resultConfigs[0], (EGLint)resultConfigs.size(), &numConfigs)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigTests.cpp"
                     ,0xbe);
  }
  chooseConfigReference((Library *)p_Var5,*egl,&local_1e8,attributes);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expected:\n  ",0xc);
  egl::(anonymous_namespace)::configListToString_abi_cxx11_
            ((string *)local_218,p_Var5,(Library *)egl,(EGLDisplay *)&local_1e8,configs);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(char *)local_218._0_8_,local_218._8_8_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Got:\n  ",7);
  egl::(anonymous_namespace)::configListToString_abi_cxx11_
            ((string *)local_218,p_Var5,(Library *)egl,(EGLDisplay *)&local_238,configs);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(char *)local_218._0_8_,local_218._8_8_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  std::set<void*,std::less<void*>,std::allocator<void*>>::
  set<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
            ((set<void*,std::less<void*>,std::allocator<void*>> *)local_1b0,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::set<void*,std::less<void*>,std::allocator<void*>>::
  set<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
            ((set<void*,std::less<void*>,std::allocator<void*>> *)local_218,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_188 == local_1f0) {
    bVar6 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<void*>,std::_Rb_tree_const_iterator<void*>>
                      (local_198,(_Base_ptr)(local_1b0 + 8),
                       (_Rb_tree_const_iterator<void_*>)local_218._24_8_);
  }
  else {
    bVar6 = false;
  }
  std::_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
  ::~_Rb_tree((_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
               *)local_218);
  std::_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
  ::~_Rb_tree((_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
               *)local_1b0);
  p_Var5 = local_1b8;
  bVar14 = 1;
  if ((long)local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (0 < (int)((ulong)((long)local_238.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3)) {
      lVar15 = 0;
      CVar10 = (ConfigAttribValueFmt)
               local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      ppvVar11 = local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      do {
        config = *(void **)((long)CVar10 + lVar15 * 8);
        if (config != local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar15]) {
          EVar8 = eglu::getConfigAttribInt((Library *)p_Var5,*egl,config,0x3027);
          EVar9 = eglu::getConfigAttribInt
                            ((Library *)p_Var5,*egl,
                             local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar15],0x3027);
          if ((EVar8 != 0x3051) ||
             (CVar10 = (ConfigAttribValueFmt)
                       local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
             ppvVar11 = local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish, EVar9 != 0x3051)) goto LAB_00e4a767;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < (int)((ulong)((long)ppvVar11 - (long)CVar10) >> 3));
    }
    bVar14 = 0;
  }
LAB_00e4a767:
  if (bVar6 == false) {
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Fail, configs don\'t match",0x19);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (((byte)local_1c4 & bVar14) == 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Pass",4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      goto LAB_00e4a895;
    }
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Fail, got correct configs but in invalid order",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  tcu::TestContext::setTestResult
            ((local_1c0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL
             ,"Fail");
LAB_00e4a895:
  if (local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (void **)0x0) {
    operator_delete(local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((ConfigAttribValueFmt)
      local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (ConfigAttribValueFmt)0x0) {
    operator_delete(local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void executeTest (const std::vector<std::pair<EGLenum, EGLint> >& attributes, bool checkOrder)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();
		TestLog&		log	= m_testCtx.getLog();

		// Build attributes for EGL
		vector<EGLint> attribList;
		for (vector<pair<EGLenum, EGLint> >::const_iterator i = attributes.begin(); i != attributes.end(); i++)
		{
			attribList.push_back(i->first);
			attribList.push_back(i->second);
		}
		attribList.push_back(EGL_NONE);

		// Print attribList to log
		log << TestLog::Message << "Attributes:" << TestLog::EndMessage;
		for (vector<pair<EGLenum, EGLint> >::const_iterator i = attributes.begin(); i != attributes.end(); i++)
			logConfigAttrib(log, i->first, i->second);

		std::vector<EGLConfig>	resultConfigs;
		std::vector<EGLConfig>	referenceConfigs;

		// Query from EGL implementation
		{
			EGLint numConfigs = 0;
			EGLU_CHECK_CALL(egl, chooseConfig(m_display, &attribList[0], DE_NULL, 0, &numConfigs));
			resultConfigs.resize(numConfigs);

			if (numConfigs > 0)
				EGLU_CHECK_CALL(egl, chooseConfig(m_display, &attribList[0], &resultConfigs[0], (EGLint)resultConfigs.size(), &numConfigs));
		}

		// Build reference
		chooseConfigReference(egl, m_display, referenceConfigs, attributes);

		log << TestLog::Message << "Expected:\n  " << configListToString(egl, m_display, referenceConfigs) << TestLog::EndMessage;
		log << TestLog::Message << "Got:\n  " << configListToString(egl, m_display, resultConfigs) << TestLog::EndMessage;

		bool isSetMatch		= (set<EGLConfig>(resultConfigs.begin(), resultConfigs.end()) == set<EGLConfig>(referenceConfigs.begin(), referenceConfigs.end()));
		bool isExactMatch	= configListEqual(egl, m_display, resultConfigs, referenceConfigs);
		bool isMatch		= isSetMatch && (checkOrder ? isExactMatch : true);

		if (isMatch)
			log << TestLog::Message << "Pass" << TestLog::EndMessage;
		else if (!isSetMatch)
			log << TestLog::Message << "Fail, configs don't match" << TestLog::EndMessage;
		else if (!isExactMatch)
			log << TestLog::Message << "Fail, got correct configs but in invalid order" << TestLog::EndMessage;

		if (!isMatch)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}